

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

string * __thiscall PhyloTree::toString_abi_cxx11_(PhyloTree *this)

{
  ulong uVar1;
  reference pvVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RSI;
  string *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  stringstream ss;
  size_t nleaves;
  size_t nedges;
  size_t nlabels;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffd70;
  ulong local_220;
  string local_218 [32];
  string local_1f8 [32];
  ulong local_1d8;
  ulong local_1d0;
  stringstream local_1c8 [16];
  ostream local_1b8 [399];
  allocator local_29;
  size_type local_28;
  size_type local_20;
  size_type local_18;
  
  local_18 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RSI + 0x38));
  local_20 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x20));
  local_28 = std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50));
  if (((local_18 == 0) || (local_20 == 0)) || (local_28 == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Empty",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(local_1b8,"Leaves: ");
    for (local_1d0 = 0; local_1d0 < local_18 - 1; local_1d0 = local_1d0 + 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RSI + 0x38),local_1d0);
      poVar3 = std::operator<<(local_1b8,(string *)pvVar2);
      std::operator<<(poVar3," ");
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd70);
    std::operator<<(local_1b8,(string *)pvVar2);
    if (local_20 != 0) {
      std::operator<<(local_1b8,"; edges: ");
      local_1d8 = 0;
      while( true ) {
        uVar1 = local_1d8;
        sVar4 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x20))
        ;
        if (sVar4 - 1 <= uVar1) break;
        pvVar5 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                           ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x20)
                            ,local_1d8);
        (**(pvVar5->super_Bipartition)._vptr_Bipartition)(local_1f8);
        poVar3 = std::operator<<(local_1b8,local_1f8);
        std::operator<<(poVar3," ");
        std::__cxx11::string::~string(local_1f8);
        local_1d8 = local_1d8 + 1;
      }
      pvVar5 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::back
                         (in_stack_fffffffffffffd70);
      (**(pvVar5->super_Bipartition)._vptr_Bipartition)(local_218);
      std::operator<<(local_1b8,local_218);
      std::__cxx11::string::~string(local_218);
    }
    if (local_28 != 0) {
      std::operator<<(local_1b8,"; leaf edges: [");
      for (local_220 = 0; local_220 < local_28 - 1; local_220 = local_220 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),local_220);
        poVar3 = (ostream *)std::ostream::operator<<(local_1b8,*pvVar6);
        std::operator<<(poVar3," ");
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::back
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
      poVar3 = (ostream *)std::ostream::operator<<(local_1b8,*pvVar6);
      std::operator<<(poVar3,"]");
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  return in_RDI;
}

Assistant:

string PhyloTree::toString() {
    size_t nlabels = this->leaf2NumMap.size();
    size_t nedges = this->edges.size();
    size_t nleaves = this->leafEdgeLengths.size();
    if (nlabels == 0 || nedges == 0 || nleaves == 0) return "Empty";
    stringstream ss;
    ss << "Leaves: ";
    for (size_t i = 0; i < nlabels - 1; ++i) {
        ss << leaf2NumMap[i] << " ";
    }
    ss << leaf2NumMap.back();
    if (nedges > 0) {
        ss << "; edges: ";
        for (size_t i = 0; i < edges.size() - 1; ++i) {
            ss << edges[i].toString() << " ";
        }
        ss << edges.back().toString();
    }
    if (nleaves > 0) {
        ss << "; leaf edges: [";
        for (size_t i = 0; i < nleaves - 1; ++i) {
            ss << leafEdgeLengths[i] << " ";
        }
        ss << leafEdgeLengths.back() << "]";
    }
    return ss.str();
}